

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWPointerArray.h
# Opt level: O0

void __thiscall
COLLADAFW::PointerArray<COLLADAFW::Transformation>::cloneContents
          (PointerArray<COLLADAFW::Transformation> *this,
          PointerArray<COLLADAFW::Transformation> *pre)

{
  int iVar1;
  size_t sVar2;
  Transformation **ppTVar3;
  undefined4 extraout_var;
  long in_RSI;
  size_t in_RDI;
  size_t i;
  size_t newCount;
  ArrayPrimitiveType<COLLADAFW::Transformation_*> *in_stack_ffffffffffffffe0;
  size_t index;
  
  sVar2 = ArrayPrimitiveType<COLLADAFW::Transformation_*>::getCount
                    ((ArrayPrimitiveType<COLLADAFW::Transformation_*> *)(in_RSI + 8));
  ArrayPrimitiveType<COLLADAFW::Transformation_*>::reallocMemory(in_stack_ffffffffffffffe0,in_RDI);
  for (index = 0; index < sVar2; index = index + 1) {
    ppTVar3 = ArrayPrimitiveType<COLLADAFW::Transformation_*>::operator[]
                        ((ArrayPrimitiveType<COLLADAFW::Transformation_*> *)(in_RSI + 8),index);
    iVar1 = (*((*ppTVar3)->super_Animatable)._vptr_Animatable[2])();
    ppTVar3 = ArrayPrimitiveType<COLLADAFW::Transformation_*>::operator[]
                        ((ArrayPrimitiveType<COLLADAFW::Transformation_*> *)(in_RDI + 8),index);
    *ppTVar3 = (Transformation *)CONCAT44(extraout_var,iVar1);
  }
  *(size_t *)(in_RDI + 0x10) = sVar2;
  return;
}

Assistant:

void cloneContents(const PointerArray& pre)
		{
			size_t newCount = pre.getCount();
			ArrayPrimitiveType<T*>::reallocMemory(newCount);
			for ( size_t i = 0; i < newCount; ++i)
			{
				(*this)[i] = pre[i]->clone();
			}
			ArrayPrimitiveType<T*>::mCount = newCount;
		}